

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

Vec_Int_t * Gia_ManSimDeriveResets(Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  int i;
  int iVar3;
  abctime aVar4;
  Vec_Int_t *p;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  int Addition;
  int Addition_00;
  abctime time;
  int iVar8;
  uint uVar9;
  char *pStr;
  int iVar10;
  uint local_54;
  uint local_50;
  uint local_4c;
  
  aVar4 = Abc_Clock();
  iVar10 = pGia->nObjs;
  iVar3 = iVar10 * 2;
  p = Vec_IntAlloc(iVar3);
  p->nSize = iVar3;
  if (p->pArray != (int *)0x0) {
    memset(p->pArray,0,(long)iVar10 << 3);
  }
  pVVar5 = Vec_IntAlloc(1000);
  for (iVar10 = 0; iVar10 < pGia->nRegs; iVar10 = iVar10 + 1) {
    pGVar6 = Gia_ManCo(pGia,(iVar10 - pGia->nRegs) + pGia->vCos->nSize);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjId(pGia,pGVar6);
    uVar9 = (uint)*(ulong *)pGVar6;
    if (uVar1 != (uVar9 & 0x1fffffff)) {
      iVar2 = Gia_ObjToLit(pGia,(Gia_Obj_t *)
                                ((ulong)(uVar9 >> 0x1d & 1) ^
                                (ulong)(pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff))));
      Vec_IntAddToEntry(p,iVar2,Addition);
      Gia_ManSimCollect(pGia,pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff),pVVar5);
      iVar2 = pVVar5->nSize;
      iVar8 = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
        iVar8 = 0;
      }
      for (; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        i = Vec_IntEntry(pVVar5,iVar8);
        Vec_IntAddToEntry(p,i,Addition_00);
      }
    }
  }
  Vec_IntFree(pVVar5);
  iVar10 = pGia->nObjs;
  pVVar5 = Vec_IntAlloc(iVar10);
  pVVar5->nSize = iVar10;
  if (pVVar5->pArray != (int *)0x0) {
    memset(pVVar5->pArray,0xff,(long)iVar10 << 2);
  }
  iVar2 = 0;
  iVar10 = 0;
  if (0 < iVar3) {
    iVar10 = iVar3;
  }
  uVar1 = 0;
  local_50 = 0;
  local_4c = 0;
  local_54 = 0;
  for (; iVar10 != iVar2; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(p,iVar2);
    if (4 < iVar3) {
      iVar3 = Abc_Lit2Var(iVar2);
      pGVar6 = Gia_ManObj(pGia,iVar3);
      iVar3 = Abc_LitIsCompl(iVar2);
      iVar8 = Abc_Lit2Var(iVar2);
      if (iVar3 == 0) {
        Vec_IntWriteEntry(pVVar5,iVar8,1);
        iVar3 = Gia_ObjIsPi(pGia,pGVar6);
        local_54 = local_54 + iVar3;
        local_50 = local_50 + 1;
      }
      else {
        Vec_IntWriteEntry(pVVar5,iVar8,0);
        iVar3 = Gia_ObjIsPi(pGia,pGVar6);
        local_4c = local_4c + iVar3;
        uVar1 = uVar1 + 1;
      }
    }
  }
  Vec_IntFree(p);
  pStr = (char *)(ulong)uVar1;
  printf("Logic0 = %d (%d). Logic1 = %d (%d). ",pStr,(ulong)local_4c,(ulong)local_50,(ulong)local_54
        );
  aVar7 = Abc_Clock();
  Abc_PrintTime((int)aVar7 - (int)aVar4,pStr,time);
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManSimDeriveResets( Gia_Man_t * pGia )
{
    int nImpLimit = 5;
    Vec_Int_t * vResult;
    Vec_Int_t * vCountLits, * vSuperGate;
    Gia_Obj_t * pObj;
    int i, k, Lit, Count;
    int Counter0 = 0, Counter1 = 0;
    int CounterPi0 = 0, CounterPi1 = 0;
    abctime clk = Abc_Clock();

    // create reset counters for each literal
    vCountLits = Vec_IntStart( 2 * Gia_ManObjNum(pGia) );

    // collect implications for each flop input driver
    vSuperGate = Vec_IntAlloc( 1000 );
    Gia_ManForEachRi( pGia, pObj, i )
    {
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            continue;
        Vec_IntAddToEntry( vCountLits, Gia_ObjToLit(pGia, Gia_ObjChild0(pObj)), 1 );
        Gia_ManSimCollect( pGia, Gia_ObjFanin0(pObj), vSuperGate );
        Vec_IntForEachEntry( vSuperGate, Lit, k )
            Vec_IntAddToEntry( vCountLits, Lit, 1 );
    }
    Vec_IntFree( vSuperGate );

    // label signals whose counter if more than the limit
    vResult = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vCountLits, Count, Lit )
    {
        if ( Count < nImpLimit )
            continue;
        pObj = Gia_ManObj( pGia, Abc_Lit2Var(Lit) );
        if ( Abc_LitIsCompl(Lit) ) // const 0
        {
//            Ssm_ObjSetLogic0( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 0 );
            CounterPi0 += Gia_ObjIsPi(pGia, pObj);
            Counter0++;
        }
        else
        {
//            Ssm_ObjSetLogic1( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 1 );
            CounterPi1 += Gia_ObjIsPi(pGia, pObj);
            Counter1++;
        }
//        if ( Gia_ObjIsPi(pGia, pObj) )
//            printf( "%d ", Count );
    }
//    printf( "\n" );
    Vec_IntFree( vCountLits );

    printf( "Logic0 = %d (%d). Logic1 = %d (%d). ", Counter0, CounterPi0, Counter1, CounterPi1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vResult;
}